

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexReaderCache::logRecentlyUsed(PtexReaderCache *this,PtexCachedReader *reader)

{
  int iVar1;
  int *piVar2;
  undefined8 in_RSI;
  long in_RDI;
  PtexReaderCache *unaff_retaddr;
  int slot;
  MruList *mruList;
  
  while( true ) {
    piVar2 = *(int **)(in_RDI + 0x480);
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    if (iVar1 < 0x32) break;
    do {
      processMru(unaff_retaddr);
    } while (0x31 < **(int **)(in_RDI + 0x480));
  }
  *(undefined8 *)(piVar2 + (long)iVar1 * 2 + 2) = in_RSI;
  return;
}

Assistant:

void PtexReaderCache::logRecentlyUsed(PtexCachedReader* reader)
{
    while (1) {
        MruList* mruList = _mruList;
        int slot = AtomicIncrement(&mruList->next)-1;
        if (slot < numMruFiles) {
            mruList->files[slot] = reader;
            return;
        }
        // no mru slot available, process mru list and try again
        do processMru();
        while (_mruList->next >= numMruFiles);
    }
}